

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
calc_avg(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *history,vector<double,_std::allocator<double>_> *new_values,size_t avg_amount)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  const_reference pvVar6;
  size_type sVar7;
  ostream *this;
  vector<double,_std::allocator<double>_> *pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  reference pdVar11;
  undefined1 auVar12 [16];
  double *d;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  size_t j;
  ulong uStack_50;
  int index;
  size_t i;
  unsigned_long local_38;
  undefined1 local_29;
  size_t local_28;
  size_t avg_amount_local;
  vector<double,_std::allocator<double>_> *new_values_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *history_local;
  vector<double,_std::allocator<double>_> *result;
  
  local_29 = 0;
  local_28 = avg_amount;
  avg_amount_local = (size_t)new_values;
  new_values_local = (vector<double,_std::allocator<double>_> *)history;
  history_local =
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,new_values);
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)new_values_local);
  local_38 = sVar4 + 1;
  puVar5 = std::min<unsigned_long>(&local_28,&local_38);
  local_28 = *puVar5;
  for (uStack_50 = 0; uStack_50 < local_28; uStack_50 = uStack_50 + 1) {
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)new_values_local);
    iVar3 = ((int)sVar4 + -1) - (int)uStack_50;
    if ((iVar3 < 0) ||
       (sVar4 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)new_values_local), (int)sVar4 <= iVar3)) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)new_values_local,(long)iVar3);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
    sVar7 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
    if (sVar4 != sVar7) {
      this = std::operator<<((ostream *)&std::cout,"ERROR: history and result size mismatch!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    for (__range1 = (vector<double,_std::allocator<double>_> *)0x0;
        pvVar8 = (vector<double,_std::allocator<double>_> *)
                 std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__),
        __range1 < pvVar8;
        __range1 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(__range1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      pvVar6 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)new_values_local,(long)iVar3);
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar6,(size_type)__range1);
      dVar1 = *pvVar9;
      pvVar10 = std::vector<double,_std::allocator<double>_>::at
                          (__return_storage_ptr__,(size_type)__range1);
      *pvVar10 = dVar1 + *pvVar10;
    }
  }
  __end1 = std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  d = (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&d), bVar2) {
    pdVar11 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(&__end1);
    auVar12._8_4_ = (int)(local_28 >> 0x20);
    auVar12._0_8_ = local_28;
    auVar12._12_4_ = 0x45300000;
    *pdVar11 = *pdVar11 /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0));
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> calc_avg(const vector<vector<double>>& history,
                             const vector<double>& new_values,
                             size_t avg_amount) {
    vector<double> result(new_values);

    // If we don't have enough values yet, use what's there (+ 1 because new values)
    avg_amount = std::min(avg_amount, history.size() + 1);

    for (size_t i = 0; i < avg_amount; i++) {
        const int index = history.size() - 1 - i;

        if (index < 0 || index >= (int)history.size()) {
            break;
        }

        if (history.at(index).size() != result.size()) {
            // TODO make this an assert
            cout << "ERROR: history and result size mismatch!" << endl;
        }

        for (size_t j = 0; j < result.size(); j++) {
            result.at(j) += history.at(index).at(j);
        }
    }

    for(double& d : result) {
        d /= avg_amount;
    }

    return result;
}